

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::log_internal::LogMessage::OstreamView::~OstreamView(OstreamView *this)

{
  bool bVar1;
  pointer pcVar2;
  Span<char> *pSVar3;
  Span<char> *this_00;
  size_type sVar4;
  pointer array;
  long lVar5;
  long lVar6;
  Span<char> msg;
  Span<char> msg_00;
  undefined1 local_28 [8];
  Span<const_char> contents;
  OstreamView *this_local;
  
  pSVar3 = *(Span<char> **)(*(long *)&this->data_->manipulated + -0x18);
  std::ios::rdbuf((streambuf *)(&this->data_->manipulated + (long)pSVar3));
  pcVar2 = Span<char>::data(&this->string_start_);
  if (pcVar2 == (pointer)0x0) {
    pSVar3 = LogMessageData::encoded_remaining(this->data_);
    this_00 = LogMessageData::encoded_remaining(this->data_);
    sVar4 = Span<char>::size(this_00);
    Span<char>::remove_suffix(pSVar3,sVar4);
    contents.len_._4_4_ = 1;
  }
  else {
    array = (pointer)std::streambuf::pbase();
    lVar5 = std::streambuf::pptr();
    lVar6 = std::streambuf::pbase();
    Span<const_char>::Span((Span<const_char> *)local_28,array,lVar5 - lVar6);
    bVar1 = Span<const_char>::empty((Span<const_char> *)local_28);
    if (bVar1) {
      contents.len_._4_4_ = 1;
    }
    else {
      sVar4 = Span<const_char>::size((Span<const_char> *)local_28);
      Span<char>::remove_prefix(&this->encoded_remaining_copy_,sVar4);
      msg.len_ = (size_type)&this->encoded_remaining_copy_;
      msg.ptr_ = (pointer)(this->string_start_).len_;
      EncodeMessageLength((log_internal *)(this->string_start_).ptr_,msg,pSVar3);
      msg_00.len_ = &this->encoded_remaining_copy_;
      msg_00.ptr_ = (pointer)(this->message_start_).len_;
      EncodeMessageLength((log_internal *)(this->message_start_).ptr_,msg_00,pSVar3);
      pSVar3 = LogMessageData::encoded_remaining(this->data_);
      pSVar3->ptr_ = (this->encoded_remaining_copy_).ptr_;
      pSVar3->len_ = (this->encoded_remaining_copy_).len_;
      contents.len_._4_4_ = 0;
    }
  }
  std::streambuf::~streambuf(this);
  return;
}

Assistant:

LogMessage::OstreamView::~OstreamView() {
  data_.manipulated.rdbuf(nullptr);
  if (!string_start_.data()) {
    // The second field header didn't fit.  Whether the first one did or not, we
    // shouldn't commit `encoded_remaining_copy_`, and we also need to zero the
    // size of `data_->encoded_remaining()` so that no more data are encoded.
    data_.encoded_remaining().remove_suffix(data_.encoded_remaining().size());
    return;
  }
  const absl::Span<const char> contents(pbase(),
                                        static_cast<size_t>(pptr() - pbase()));
  if (contents.empty()) return;
  encoded_remaining_copy_.remove_prefix(contents.size());
  EncodeMessageLength(string_start_, &encoded_remaining_copy_);
  EncodeMessageLength(message_start_, &encoded_remaining_copy_);
  data_.encoded_remaining() = encoded_remaining_copy_;
}